

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void skewness_api_suite::test_full(void)

{
  bool bVar1;
  undefined1 local_48 [8];
  moment_skewness<double,_4> filter;
  
  trial::online::interim::basic_moment<double,_4UL,_(trial::online::with)3>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)3> *)local_48);
  bVar1 = trial::online::interim::detail::
          basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::full
                    ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)
                     local_48);
  boost::detail::test_impl
            ("!filter.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1ed,"void skewness_api_suite::test_full()",!bVar1);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)local_48,
             1.0);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)local_48,
             2.0);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)local_48,
             3.0);
  bVar1 = trial::online::interim::detail::
          basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::full
                    ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)
                     local_48);
  boost::detail::test_impl
            ("!filter.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1f1,"void skewness_api_suite::test_full()",!bVar1);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)local_48,
             4.0);
  bVar1 = trial::online::interim::detail::
          basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::full
                    ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)
                     local_48);
  boost::detail::test_impl
            ("filter.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,499,"void skewness_api_suite::test_full()",bVar1);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)local_48,
             5.0);
  bVar1 = trial::online::interim::detail::
          basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3>::full
                    ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)3> *)
                     local_48);
  boost::detail::test_impl
            ("filter.full()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0x1f5,"void skewness_api_suite::test_full()",(bool)(-bVar1 & 1));
  return;
}

Assistant:

void test_full()
{
    interim::moment_skewness<double, 4> filter;
    TRIAL_TEST(!filter.full());
    filter.push(1.0);
    filter.push(2.0);
    filter.push(3.0);
    TRIAL_TEST(!filter.full());
    filter.push(4.0);
    TRIAL_TEST(filter.full());
    filter.push(5.0);
    TRIAL_TEST(filter.full());
}